

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  BlockStatementSyntax *pBVar1;
  Token TVar2;
  NamedBlockClauseSyntax **unaff_retaddr;
  BumpAllocator *in_stack_00000018;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000020;
  BumpAllocator *in_stack_000000b8;
  Token *in_stack_000000c0;
  BumpAllocator *in_stack_ffffffffffffff68;
  NamedBlockClauseSyntax *in_stack_ffffffffffffff70;
  NamedBlockClauseSyntax *local_80;
  NamedBlockClauseSyntax *local_70;
  BumpAllocator *this;
  Token *args_6;
  
  args_6 = (Token *)__fn;
  if (*(long *)(__fn + 0x18) != 0) {
    deepClone<slang::syntax::NamedLabelSyntax>
              ((NamedLabelSyntax *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000020,in_stack_00000018);
  TVar2 = parsing::Token::deepClone(in_stack_000000c0,in_stack_000000b8);
  this = TVar2._0_8_;
  if (args_6[6].info == (Info *)0x0) {
    local_70 = (NamedBlockClauseSyntax *)0x0;
  }
  else {
    local_70 = deepClone<slang::syntax::NamedBlockClauseSyntax>
                         (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  deepClone<slang::syntax::SyntaxNode>
            ((SyntaxList<slang::syntax::SyntaxNode> *)in_stack_00000020,in_stack_00000018);
  TVar2 = parsing::Token::deepClone(in_stack_000000c0,in_stack_000000b8);
  if (args_6[0xb].info == (Info *)0x0) {
    local_80 = (NamedBlockClauseSyntax *)0x0;
  }
  else {
    local_80 = deepClone<slang::syntax::NamedBlockClauseSyntax>
                         (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  pBVar1 = BumpAllocator::
           emplace<slang::syntax::BlockStatementSyntax,slang::syntax::SyntaxKind_const&,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::NamedBlockClauseSyntax*,slang::syntax::SyntaxList<slang::syntax::SyntaxNode>&,slang::parsing::Token,slang::syntax::NamedBlockClauseSyntax*>
                     (this,(SyntaxKind *)local_70,(NamedLabelSyntax **)TVar2.info,TVar2._0_8_,
                      (Token *)local_80,(NamedBlockClauseSyntax **)__fn,
                      (SyntaxList<slang::syntax::SyntaxNode> *)__child_stack,args_6,unaff_retaddr);
  return (int)pBVar1;
}

Assistant:

static SyntaxNode* clone(const BlockStatementSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<BlockStatementSyntax>(
        node.kind,
        node.label ? deepClone(*node.label, alloc) : nullptr,
        *deepClone(node.attributes, alloc),
        node.begin.deepClone(alloc),
        node.blockName ? deepClone(*node.blockName, alloc) : nullptr,
        *deepClone(node.items, alloc),
        node.end.deepClone(alloc),
        node.endBlockName ? deepClone(*node.endBlockName, alloc) : nullptr
    );
}